

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O1

QWidget * QApplication::widgetAt(QPoint *p)

{
  QWidgetData *pQVar1;
  QPoint QVar2;
  bool bVar3;
  char cVar4;
  QWidget *this;
  QPoint QVar5;
  QWidget *pQVar6;
  QWidget *pQVar7;
  long in_FS_OFFSET;
  QRegion newmask;
  QRegion oldmask;
  QRegion local_68;
  QRect local_60;
  QRegion local_50;
  QRegion local_48;
  QRegion local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this = topLevelAt(p);
  if (this == (QWidget *)0x0) {
    pQVar7 = (QWidget *)0x0;
  }
  else {
    bVar3 = QWidget::testAttribute_helper(this,WA_TransparentForMouseEvents);
    if (bVar3) {
      pQVar7 = (QWidget *)0x0;
    }
    else {
      local_60._0_8_ = QWidget::mapFromGlobal(this,p);
      pQVar7 = QWidget::childAt(this,(QPoint *)&local_60);
    }
    if ((pQVar7 == (QWidget *)0x0) &&
       (bVar3 = QWidget::testAttribute_helper(this,WA_TransparentForMouseEvents), pQVar7 = this,
       bVar3)) {
      QVar2 = *p;
      QVar5 = *p;
      local_40.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
      QWidget::mask((QWidget *)&local_40);
      local_60._0_8_ = QVar5;
      QVar5 = QWidget::mapFromGlobal(this,(QPoint *)&local_60);
      local_48.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
      cVar4 = QRegion::isEmpty();
      if (cVar4 == '\0') {
        QRegion::QRegion(&local_50,&local_40);
      }
      else {
        pQVar1 = this->data;
        local_60.x2.m_i = (pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i;
        local_60.y2.m_i = (pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i;
        local_60.x1.m_i = 0;
        local_60.y1.m_i = 0;
        QRegion::QRegion(&local_50,&local_60,Rectangle);
      }
      pQVar7 = (QWidget *)0x0;
      QRegion::QRegion(&local_68,QVar5.xp.m_i.m_i,QVar5.yp.m_i.m_i,1,1,Rectangle);
      QRegion::operator-(&local_48,&local_50);
      QRegion::~QRegion(&local_68);
      QRegion::~QRegion(&local_50);
      QWidget::setMask(this,&local_48);
      pQVar6 = topLevelAt(p);
      if (pQVar6 != this) {
        local_60._0_8_ = QVar2;
        pQVar7 = widgetAt((QPoint *)&local_60);
      }
      cVar4 = QRegion::isEmpty();
      if (cVar4 == '\0') {
        QWidget::setMask(this,&local_40);
      }
      else {
        QWidget::clearMask(this);
      }
      QRegion::~QRegion(&local_48);
      QRegion::~QRegion(&local_40);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return pQVar7;
}

Assistant:

QWidget *QApplication::widgetAt(const QPoint &p)
{
    QWidget *window = QApplication::topLevelAt(p);
    if (!window)
        return nullptr;

    QWidget *child = nullptr;

    if (!window->testAttribute(Qt::WA_TransparentForMouseEvents))
        child = window->childAt(window->mapFromGlobal(p));

    if (child)
        return child;

    if (window->testAttribute(Qt::WA_TransparentForMouseEvents)) {
        //shoot a hole in the widget and try once again,
        //suboptimal on Qt for Embedded Linux where we do
        //know the stacking order of the toplevels.
        int x = p.x();
        int y = p.y();
        QRegion oldmask = window->mask();
        QPoint wpoint = window->mapFromGlobal(QPoint(x, y));
        QRegion newmask = (oldmask.isEmpty() ? QRegion(window->rect()) : oldmask)
                          - QRegion(wpoint.x(), wpoint.y(), 1, 1);
        window->setMask(newmask);
        QWidget *recurse = nullptr;
        if (QApplication::topLevelAt(p) != window) // verify recursion will terminate
            recurse = widgetAt(x, y);
        if (oldmask.isEmpty())
            window->clearMask();
        else
            window->setMask(oldmask);
        return recurse;
    }
    return window;
}